

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeparser.cpp
# Opt level: O2

ParsedSection __thiscall
QDateTimeParser::findTimeZone
          (QDateTimeParser *this,QStringView str,QDateTime *when,int maxVal,int minVal,int mode)

{
  long lVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  long in_FS_OFFSET;
  QLatin1StringView s;
  ParsedSection PVar7;
  QStringView str_local;
  
  str_local.m_data = str.m_data;
  str_local.m_size = str.m_size;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar5 = 0x200000000;
  if (mode == 1) {
    if ((str_local.m_size == 1) && (*str_local.m_data == L'Z')) {
      uVar3 = 0;
      uVar4 = 0;
      uVar6 = 0x100000000;
      goto LAB_003be3cc;
    }
LAB_003be2ed:
    PVar7 = findUtcOffset(this,str,mode);
    uVar6 = PVar7._0_8_ >> 0x20;
  }
  else {
    if (mode != 4) goto LAB_003be2ed;
    uVar6 = 0;
    PVar7 = (ParsedSection)ZEXT816(0xffffffffffffffff);
  }
  if ((mode - 4U < 0xfffffffe) && ((int)uVar6 < 1)) {
    PVar7 = findTimeZoneName(this,str,when);
    uVar6 = PVar7._0_8_ >> 0x20;
  }
  uVar4 = PVar7._8_8_;
  if (((uVar4 & 0xffffffff00000000) == 0x200000000) &&
     (PVar7.value < minVal || maxVal < PVar7.value)) {
    uVar4 = (ulong)(uint)PVar7.zeroes | 0x100000000;
  }
  if (0 < (int)uVar6) {
    uVar5 = uVar4 & 0xffffffff00000000;
    uVar6 = uVar6 << 0x20;
    uVar3 = PVar7._0_8_ & 0xffffffff;
    uVar4 = uVar4 & 0xffffffff;
    goto LAB_003be3cc;
  }
  uVar6 = 0x100000000;
  if (mode == 1) {
    s.m_data = "UTC";
    s.m_size = 3;
    bVar2 = QStringView::startsWith(&str_local,s,CaseSensitive);
    if (bVar2) {
      uVar6 = 0x300000000;
    }
    else if ((str_local.m_size == 0) || (*str_local.m_data != L'Z')) goto LAB_003be3bf;
    uVar3 = 0;
    uVar4 = 0;
  }
  else {
LAB_003be3bf:
    uVar3 = 0xffffffff;
    uVar6 = 0;
    uVar4 = 0;
    uVar5 = 0;
  }
LAB_003be3cc:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    PVar7._0_8_ = uVar3 | uVar6;
    PVar7.zeroes = (int)(uVar5 | uVar4);
    PVar7.state = (int)((uVar5 | uVar4) >> 0x20);
    return PVar7;
  }
  __stack_chk_fail();
}

Assistant:

QDateTimeParser::ParsedSection
QDateTimeParser::findTimeZone(QStringView str, const QDateTime &when,
                              int maxVal, int minVal, int mode) const
{
    Q_ASSERT(mode > 0 && mode <= 4);
    // Short-cut Zulu suffix when it's all there is (rather than a prefix match):
    if (mode == 1 && str == u'Z')
        return ParsedSection(Acceptable, 0, 1);

    ParsedSection section;
    if (mode != 4)
        section = findUtcOffset(str, mode);
    if (mode != 2 && mode != 3 && section.used <= 0)  // if nothing used, try time zone parsing
        section = findTimeZoneName(str, when);
    // It can be a well formed time zone specifier, but with value out of range
    if (section.state == Acceptable && (section.value < minVal || section.value > maxVal))
        section.state = Intermediate;
    if (section.used > 0)
        return section;

    if (mode == 1) {
        // Check if string is UTC or alias to UTC, after all other options
        if (str.startsWith("UTC"_L1))
            return ParsedSection(Acceptable, 0, 3);
        if (str.startsWith(u'Z'))
            return ParsedSection(Acceptable, 0, 1);
    }

    return ParsedSection();
}